

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
          (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  Index IVar1;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  Scalar SVar2;
  scalar_sum_op<double,_double> *in_stack_00000018;
  scalar_sum_op<double,_double> local_9 [9];
  
  EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived(in_RDI);
  internal::scalar_sum_op<double,_double>::scalar_sum_op(local_9);
  SVar2 = DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          redux<Eigen::internal::scalar_sum_op<double,double>>(this,in_stack_00000018);
  IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size(in_RDI);
  return SVar2 / (double)IVar1;
}

Assistant:

EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::mean() const
{
#ifdef __INTEL_COMPILER
  #pragma warning push
  #pragma warning ( disable : 2259 )
#endif
  return Scalar(derived().redux(Eigen::internal::scalar_sum_op<Scalar,Scalar>())) / Scalar(this->size());
#ifdef __INTEL_COMPILER
  #pragma warning pop
#endif
}